

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateCacheVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateCacheVkImpl::PipelineStateCacheVkImpl
          (PipelineStateCacheVkImpl *this,IReferenceCounters *pRefCounters,
          RenderDeviceVkImpl *pRenderDeviceVk,PipelineStateCacheCreateInfo *CreateInfo)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [12];
  undefined1 auVar7 [13];
  undefined1 auVar8 [14];
  PSO_CACHE_MODE b;
  RenderDeviceVkImpl *this_00;
  VulkanPhysicalDevice *this_01;
  VulkanLogicalDevice *this_02;
  bool bVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  PipelineCacheWrapper local_a0;
  undefined8 local_88;
  VkPipelineCacheHeaderVersionOne HeaderVersion;
  VkPhysicalDeviceProperties *Props;
  VkPipelineCacheCreateInfo VkPipelineStateCacheCI;
  PipelineStateCacheCreateInfo *CreateInfo_local;
  RenderDeviceVkImpl *pRenderDeviceVk_local;
  IReferenceCounters *pRefCounters_local;
  PipelineStateCacheVkImpl *this_local;
  
  PipelineStateCacheBase<Diligent::EngineVkImplTraits>::PipelineStateCacheBase
            (&this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>,pRefCounters,
             pRenderDeviceVk,CreateInfo,false);
  (this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
  .super_ObjectBase<Diligent::IPipelineStateCacheVk>.
  super_RefCountedObject<Diligent::IPipelineStateCacheVk>.super_IPipelineStateCacheVk.
  super_IPipelineStateCache.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_0139bfa0;
  VulkanUtilities::VulkanObjectWrapper<VkPipelineCache_T_*,_(VulkanUtilities::VulkanHandleTypeId)22>
  ::VulkanObjectWrapper(&this->m_PipelineStateCache);
  b = Diligent::operator|(PSO_CACHE_MODE_LOAD,PSO_CACHE_MODE_STORE);
  Diligent::operator|=
            (&(this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
              .m_Desc.Mode,b);
  memset(&Props,0,0x28);
  Props._0_4_ = 0x11;
  if ((CreateInfo->pCacheData != (void *)0x0) && (0x20 < CreateInfo->CacheDataSize)) {
    this_00 = DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
              ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
                           *)this);
    this_01 = RenderDeviceVkImpl::GetPhysicalDevice(this_00);
    HeaderVersion.pipelineCacheUUID._8_8_ =
         VulkanUtilities::VulkanPhysicalDevice::GetProperties(this_01);
    puVar1 = (undefined8 *)CreateInfo->pCacheData;
    uVar2 = *puVar1;
    HeaderVersion._0_8_ = puVar1[1];
    HeaderVersion._8_8_ = puVar1[2];
    HeaderVersion.pipelineCacheUUID._0_8_ = puVar1[3];
    local_88._4_4_ = (int)((ulong)uVar2 >> 0x20);
    bVar9 = local_88._4_4_ == 1;
    local_88 = uVar2;
    if ((bVar9) &&
       (((local_88._0_4_ = (int)uVar2, bVar9 = (int)local_88 == 0x20, bVar9 &&
         (HeaderVersion.headerVersion ==
          ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->deviceID)) &&
        (HeaderVersion.headerSize ==
         ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->vendorID)))) {
      cVar10 = -((uint8_t)HeaderVersion.vendorID ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[0]);
      cVar11 = -(HeaderVersion.vendorID._1_1_ ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[1]);
      cVar12 = -(HeaderVersion.vendorID._2_1_ ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[2]);
      cVar13 = -(HeaderVersion.vendorID._3_1_ ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[3]);
      cVar14 = -((uint8_t)HeaderVersion.deviceID ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[4]);
      cVar15 = -(HeaderVersion.deviceID._1_1_ ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[5]);
      cVar16 = -(HeaderVersion.deviceID._2_1_ ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[6]);
      cVar17 = -(HeaderVersion.deviceID._3_1_ ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[7]);
      cVar18 = -(HeaderVersion.pipelineCacheUUID[0] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[8]);
      cVar19 = -(HeaderVersion.pipelineCacheUUID[1] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[9]);
      cVar20 = -(HeaderVersion.pipelineCacheUUID[2] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[10]);
      cVar21 = -(HeaderVersion.pipelineCacheUUID[3] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[0xb]);
      cVar22 = -(HeaderVersion.pipelineCacheUUID[4] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[0xc]);
      cVar23 = -(HeaderVersion.pipelineCacheUUID[5] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[0xd]);
      cVar24 = -(HeaderVersion.pipelineCacheUUID[6] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[0xe]);
      bVar25 = -(HeaderVersion.pipelineCacheUUID[7] ==
                ((VkPhysicalDeviceProperties *)HeaderVersion.pipelineCacheUUID._8_8_)->
                pipelineCacheUUID[0xf]);
      auVar3[1] = cVar11;
      auVar3[0] = cVar10;
      auVar3[2] = cVar12;
      auVar3[3] = cVar13;
      auVar3[4] = cVar14;
      auVar3[5] = cVar15;
      auVar3[6] = cVar16;
      auVar3[7] = cVar17;
      auVar3[8] = cVar18;
      auVar3[9] = cVar19;
      auVar3[10] = cVar20;
      auVar3[0xb] = cVar21;
      auVar3[0xc] = cVar22;
      auVar3[0xd] = cVar23;
      auVar3[0xe] = cVar24;
      auVar3[0xf] = bVar25;
      auVar4[1] = cVar11;
      auVar4[0] = cVar10;
      auVar4[2] = cVar12;
      auVar4[3] = cVar13;
      auVar4[4] = cVar14;
      auVar4[5] = cVar15;
      auVar4[6] = cVar16;
      auVar4[7] = cVar17;
      auVar4[8] = cVar18;
      auVar4[9] = cVar19;
      auVar4[10] = cVar20;
      auVar4[0xb] = cVar21;
      auVar4[0xc] = cVar22;
      auVar4[0xd] = cVar23;
      auVar4[0xe] = cVar24;
      auVar4[0xf] = bVar25;
      auVar8[1] = cVar13;
      auVar8[0] = cVar12;
      auVar8[2] = cVar14;
      auVar8[3] = cVar15;
      auVar8[4] = cVar16;
      auVar8[5] = cVar17;
      auVar8[6] = cVar18;
      auVar8[7] = cVar19;
      auVar8[8] = cVar20;
      auVar8[9] = cVar21;
      auVar8[10] = cVar22;
      auVar8[0xb] = cVar23;
      auVar8[0xc] = cVar24;
      auVar8[0xd] = bVar25;
      auVar7[1] = cVar14;
      auVar7[0] = cVar13;
      auVar7[2] = cVar15;
      auVar7[3] = cVar16;
      auVar7[4] = cVar17;
      auVar7[5] = cVar18;
      auVar7[6] = cVar19;
      auVar7[7] = cVar20;
      auVar7[8] = cVar21;
      auVar7[9] = cVar22;
      auVar7[10] = cVar23;
      auVar7[0xb] = cVar24;
      auVar7[0xc] = bVar25;
      auVar6[1] = cVar15;
      auVar6[0] = cVar14;
      auVar6[2] = cVar16;
      auVar6[3] = cVar17;
      auVar6[4] = cVar18;
      auVar6[5] = cVar19;
      auVar6[6] = cVar20;
      auVar6[7] = cVar21;
      auVar6[8] = cVar22;
      auVar6[9] = cVar23;
      auVar6[10] = cVar24;
      auVar6[0xb] = bVar25;
      auVar5[1] = cVar16;
      auVar5[0] = cVar15;
      auVar5[2] = cVar17;
      auVar5[3] = cVar18;
      auVar5[4] = cVar19;
      auVar5[5] = cVar20;
      auVar5[6] = cVar21;
      auVar5[7] = cVar22;
      auVar5[8] = cVar23;
      auVar5[9] = cVar24;
      auVar5[10] = bVar25;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar8 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar7 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar6 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(cVar22,
                                                  CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(cVar19,
                                                  CONCAT12(cVar18,CONCAT11(cVar17,cVar16))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(cVar22,
                                                  CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(cVar19,
                                                  CONCAT11(cVar18,cVar17)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar25 >> 7) << 0xf) == 0xffff) {
        VkPipelineStateCacheCI._16_8_ = ZEXT48(CreateInfo->CacheDataSize);
        VkPipelineStateCacheCI.initialDataSize = (size_t)CreateInfo->pCacheData;
      }
    }
  }
  this_02 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
                       .m_pDevice);
  VulkanUtilities::VulkanLogicalDevice::CreatePipelineCache
            (&local_a0,this_02,(VkPipelineCacheCreateInfo *)&Props,
             (this->super_PipelineStateCacheBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateCacheVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateCacheDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipelineCache_T_*,_(VulkanUtilities::VulkanHandleTypeId)22>
  ::operator=(&this->m_PipelineStateCache,&local_a0);
  VulkanUtilities::VulkanObjectWrapper<VkPipelineCache_T_*,_(VulkanUtilities::VulkanHandleTypeId)22>
  ::~VulkanObjectWrapper(&local_a0);
  return;
}

Assistant:

PipelineStateCacheVkImpl::PipelineStateCacheVkImpl(IReferenceCounters*                 pRefCounters,
                                                   RenderDeviceVkImpl*                 pRenderDeviceVk,
                                                   const PipelineStateCacheCreateInfo& CreateInfo) :
    // clang-format off
    TPipelineStateCacheBase
    {
        pRefCounters,
        pRenderDeviceVk,
        CreateInfo,
        false
    }
// clang-format on
{
    // Separate load/store is not supported in Vulkan.
    m_Desc.Mode |= PSO_CACHE_MODE_LOAD | PSO_CACHE_MODE_STORE;

    VkPipelineCacheCreateInfo VkPipelineStateCacheCI{};
    VkPipelineStateCacheCI.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;

    if (CreateInfo.pCacheData != nullptr && CreateInfo.CacheDataSize > sizeof(VkPipelineCacheHeaderVersionOne))
    {
        const auto& Props = GetDevice()->GetPhysicalDevice().GetProperties();

        VkPipelineCacheHeaderVersionOne HeaderVersion;
        std::memcpy(&HeaderVersion, CreateInfo.pCacheData, sizeof(HeaderVersion));

        if (HeaderVersion.headerVersion == VK_PIPELINE_CACHE_HEADER_VERSION_ONE &&
            HeaderVersion.headerSize == 32 && // from specs
            HeaderVersion.deviceID == Props.deviceID &&
            HeaderVersion.vendorID == Props.vendorID &&
            std::memcmp(HeaderVersion.pipelineCacheUUID, Props.pipelineCacheUUID, sizeof(HeaderVersion.pipelineCacheUUID)) == 0)
        {
            VkPipelineStateCacheCI.initialDataSize = CreateInfo.CacheDataSize;
            VkPipelineStateCacheCI.pInitialData    = CreateInfo.pCacheData;
        }
    }

    m_PipelineStateCache = m_pDevice->GetLogicalDevice().CreatePipelineCache(VkPipelineStateCacheCI, m_Desc.Name);
}